

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O0

IncrementPrecision *
icu_63::number::Precision::constructIncrement
          (IncrementPrecision *__return_storage_ptr__,double increment,int32_t minFrac)

{
  PrecisionType local_3c;
  undefined1 local_38 [8];
  PrecisionUnion union_;
  IncrementSettings settings;
  int32_t minFrac_local;
  double increment_local;
  
  settings.fIncrement._0_2_ = (undefined2)minFrac;
  union_._8_8_ = increment;
  settings._12_4_ = minFrac;
  settings.fIncrement._2_2_ = impl::roundingutils::doubleFractionLength(increment);
  local_38 = (undefined1  [8])union_._8_8_;
  union_._2_2_ = settings.fIncrement._2_2_;
  union_._0_2_ = settings.fIncrement._0_2_;
  union_._4_2_ = settings.fIncrement._4_2_;
  union_._6_2_ = settings.fIncrement._6_2_;
  local_3c = RND_INCREMENT;
  IncrementPrecision::Precision
            (__return_storage_ptr__,&local_3c,(PrecisionUnion *)local_38,UNUM_FOUND_HALFEVEN);
  return __return_storage_ptr__;
}

Assistant:

IncrementPrecision Precision::constructIncrement(double increment, int32_t minFrac) {
    IncrementSettings settings;
    settings.fIncrement = increment;
    settings.fMinFrac = static_cast<digits_t>(minFrac);
    // One of the few pre-computed quantities:
    // Note: it is possible for minFrac to be more than maxFrac... (misleading)
    settings.fMaxFrac = roundingutils::doubleFractionLength(increment);
    PrecisionUnion union_;
    union_.increment = settings;
    return {RND_INCREMENT, union_, kDefaultMode};
}